

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage3Runner.hpp
# Opt level: O0

void __thiscall Centaurus::Stage3Runner::thread_runner_impl(Stage3Runner *this)

{
  SVCapsule local_28;
  Stage3Runner *local_10;
  Stage3Runner *this_local;
  
  this->m_current_bank = -1;
  this->m_counter = 0;
  this->m_current_window = (uint64_t *)0x0;
  this->m_window_position = 0;
  local_10 = this;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->val_stack);
  reduce(&local_28,this);
  release_bank(this);
  return;
}

Assistant:

void thread_runner_impl()
  {
    m_current_bank = -1;
    m_counter = 0;
    m_current_window = NULL;
    m_window_position = 0;
    val_stack.clear();

    reduce();

    release_bank();
  }